

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateSnapshot.cxx
# Opt level: O0

void __thiscall cmStateSnapshot::SetDefaultDefinitions(cmStateSnapshot *this)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  PointerType pSVar4;
  PointerType pBVar5;
  allocator local_899;
  string local_898;
  allocator local_871;
  string local_870;
  allocator local_849;
  string local_848;
  allocator local_821;
  string local_820;
  allocator local_7f9;
  string local_7f8;
  allocator local_7d1;
  string local_7d0;
  allocator local_7a9;
  string local_7a8;
  allocator local_781;
  string local_780;
  allocator local_759;
  string local_758;
  allocator local_731;
  string local_730;
  allocator local_709;
  string local_708;
  allocator local_6e1;
  string local_6e0;
  allocator local_6b9;
  string local_6b8;
  char local_698 [8];
  char temp [1024];
  allocator local_289;
  string local_288;
  allocator local_261;
  string local_260;
  undefined1 local_23f [8];
  utsname uts_name;
  allocator local_91;
  string local_90;
  allocator local_69;
  string local_68;
  allocator local_31;
  string local_30;
  cmStateSnapshot *local_10;
  cmStateSnapshot *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"UNIX",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"1",&local_69);
  SetDefinition(this,&local_30,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_90,"CMAKE_HOST_UNIX",&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(uts_name.domainname + 0x3a),"1",(allocator *)(uts_name.domainname + 0x39));
  SetDefinition(this,&local_90,(string *)(uts_name.domainname + 0x3a));
  std::__cxx11::string::~string((string *)(uts_name.domainname + 0x3a));
  std::allocator<char>::~allocator((allocator<char> *)(uts_name.domainname + 0x39));
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  iVar1 = uname((utsname *)local_23f);
  if (-1 < iVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_260,"CMAKE_HOST_SYSTEM_NAME",&local_261);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_288,local_23f,&local_289);
    SetDefinition(this,&local_260,&local_288);
    std::__cxx11::string::~string((string *)&local_288);
    std::allocator<char>::~allocator((allocator<char> *)&local_289);
    std::__cxx11::string::~string((string *)&local_260);
    std::allocator<char>::~allocator((allocator<char> *)&local_261);
  }
  uVar2 = cmVersion::GetMinorVersion();
  sprintf(local_698,"%d",(ulong)uVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_6b8,"CMAKE_MINOR_VERSION",&local_6b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_6e0,local_698,&local_6e1);
  SetDefinition(this,&local_6b8,&local_6e0);
  std::__cxx11::string::~string((string *)&local_6e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6e1);
  std::__cxx11::string::~string((string *)&local_6b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6b9);
  uVar2 = cmVersion::GetMajorVersion();
  sprintf(local_698,"%d",(ulong)uVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_708,"CMAKE_MAJOR_VERSION",&local_709);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_730,local_698,&local_731);
  SetDefinition(this,&local_708,&local_730);
  std::__cxx11::string::~string((string *)&local_730);
  std::allocator<char>::~allocator((allocator<char> *)&local_731);
  std::__cxx11::string::~string((string *)&local_708);
  std::allocator<char>::~allocator((allocator<char> *)&local_709);
  uVar2 = cmVersion::GetPatchVersion();
  sprintf(local_698,"%d",(ulong)uVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_758,"CMAKE_PATCH_VERSION",&local_759);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_780,local_698,&local_781);
  SetDefinition(this,&local_758,&local_780);
  std::__cxx11::string::~string((string *)&local_780);
  std::allocator<char>::~allocator((allocator<char> *)&local_781);
  std::__cxx11::string::~string((string *)&local_758);
  std::allocator<char>::~allocator((allocator<char> *)&local_759);
  uVar2 = cmVersion::GetTweakVersion();
  sprintf(local_698,"%d",(ulong)uVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_7a8,"CMAKE_TWEAK_VERSION",&local_7a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_7d0,local_698,&local_7d1);
  SetDefinition(this,&local_7a8,&local_7d0);
  std::__cxx11::string::~string((string *)&local_7d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7d1);
  std::__cxx11::string::~string((string *)&local_7a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_7a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_7f8,"CMAKE_VERSION",&local_7f9);
  pcVar3 = cmVersion::GetCMakeVersion();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_820,pcVar3,&local_821);
  SetDefinition(this,&local_7f8,&local_820);
  std::__cxx11::string::~string((string *)&local_820);
  std::allocator<char>::~allocator((allocator<char> *)&local_821);
  std::__cxx11::string::~string((string *)&local_7f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_7f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_848,"CMAKE_FILES_DIRECTORY",&local_849);
  pcVar3 = cmake::GetCMakeFilesDirectory();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_870,pcVar3,&local_871);
  SetDefinition(this,&local_848,&local_870);
  std::__cxx11::string::~string((string *)&local_870);
  std::allocator<char>::~allocator((allocator<char> *)&local_871);
  std::__cxx11::string::~string((string *)&local_848);
  std::allocator<char>::~allocator((allocator<char> *)&local_849);
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&this->Position);
  pBVar5 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar4->BuildSystemDirectory);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_898,"INCLUDE_REGULAR_EXPRESSION",&local_899);
  cmPropertyMap::SetProperty(&pBVar5->Properties,&local_898,"^.*$");
  std::__cxx11::string::~string((string *)&local_898);
  std::allocator<char>::~allocator((allocator<char> *)&local_899);
  return;
}

Assistant:

void cmStateSnapshot::SetDefaultDefinitions()
{
/* Up to CMake 2.4 here only WIN32, UNIX and APPLE were set.
  With CMake must separate between target and host platform. In most cases
  the tests for WIN32, UNIX and APPLE will be for the target system, so an
  additional set of variables for the host system is required ->
  CMAKE_HOST_WIN32, CMAKE_HOST_UNIX, CMAKE_HOST_APPLE.
  WIN32, UNIX and APPLE are now set in the platform files in
  Modules/Platforms/.
  To keep cmake scripts (-P) and custom language and compiler modules
  working, these variables are still also set here in this place, but they
  will be reset in CMakeSystemSpecificInformation.cmake before the platform
  files are executed. */
#if defined(_WIN32)
  this->SetDefinition("WIN32", "1");
  this->SetDefinition("CMAKE_HOST_WIN32", "1");
  this->SetDefinition("CMAKE_HOST_SYSTEM_NAME", "Windows");
#else
  this->SetDefinition("UNIX", "1");
  this->SetDefinition("CMAKE_HOST_UNIX", "1");

  struct utsname uts_name;
  if (uname(&uts_name) >= 0) {
    this->SetDefinition("CMAKE_HOST_SYSTEM_NAME", uts_name.sysname);
  }
#endif
#if defined(__CYGWIN__)
  std::string legacy;
  if (cmSystemTools::GetEnv("CMAKE_LEGACY_CYGWIN_WIN32", legacy) &&
      cmSystemTools::IsOn(legacy.c_str())) {
    this->SetDefinition("WIN32", "1");
    this->SetDefinition("CMAKE_HOST_WIN32", "1");
  }
#endif
#if defined(__APPLE__)
  this->SetDefinition("APPLE", "1");
  this->SetDefinition("CMAKE_HOST_APPLE", "1");
#endif
#if defined(__sun__)
  this->SetDefinition("CMAKE_HOST_SOLARIS", "1");
#endif

  char temp[1024];
  sprintf(temp, "%d", cmVersion::GetMinorVersion());
  this->SetDefinition("CMAKE_MINOR_VERSION", temp);
  sprintf(temp, "%d", cmVersion::GetMajorVersion());
  this->SetDefinition("CMAKE_MAJOR_VERSION", temp);
  sprintf(temp, "%d", cmVersion::GetPatchVersion());
  this->SetDefinition("CMAKE_PATCH_VERSION", temp);
  sprintf(temp, "%d", cmVersion::GetTweakVersion());
  this->SetDefinition("CMAKE_TWEAK_VERSION", temp);
  this->SetDefinition("CMAKE_VERSION", cmVersion::GetCMakeVersion());

  this->SetDefinition("CMAKE_FILES_DIRECTORY",
                      cmake::GetCMakeFilesDirectory());

  // Setup the default include file regular expression (match everything).
  this->Position->BuildSystemDirectory->Properties.SetProperty(
    "INCLUDE_REGULAR_EXPRESSION", "^.*$");
}